

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
gdscpp::findRootSTR(vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
                   gdscpp *this)

{
  iterator __position;
  long lVar1;
  uint in_EAX;
  int iVar2;
  pointer pgVar3;
  pointer pgVar4;
  uint uVar5;
  ulong uVar6;
  uint *puVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  undefined8 uStack_38;
  
  uStack_38._0_4_ = in_EAX;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Finding the root structures.",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_38 = (ulong)(uint)uStack_38;
  pgVar3 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
           super__Vector_impl_data._M_start;
  pgVar4 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pgVar4 != pgVar3) {
    do {
      if (pgVar4 != pgVar3) {
        uVar9 = 0;
        do {
          if (pgVar3[uVar9].SREF.super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              pgVar3[uVar9].SREF.super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar6 = 1;
            do {
              iVar2 = std::__cxx11::string::compare((string *)(pgVar3 + (uStack_38 >> 0x20)));
              if (iVar2 == 0) goto LAB_0010a16f;
              pgVar3 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar8 = ((long)pgVar3[uVar9].SREF.
                             super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)pgVar3[uVar9].SREF.
                             super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl.
                             super__Vector_impl_data._M_start >> 3) * -0x1111111111111111;
              bVar10 = uVar6 <= uVar8;
              lVar1 = uVar8 - uVar6;
              uVar6 = (ulong)((int)uVar6 + 1);
            } while (bVar10 && lVar1 != 0);
            pgVar4 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          }
          uVar9 = (ulong)((int)uVar9 + 1);
          uVar6 = ((long)pgVar4 - (long)pgVar3 >> 3) * -0x1084210842108421;
        } while (uVar9 <= uVar6 && uVar6 - uVar9 != 0);
      }
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
                   __position,(uint *)((long)&uStack_38 + 4));
      }
      else {
        *__position._M_current = uStack_38._4_4_;
        (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
LAB_0010a16f:
      uVar5 = uStack_38._4_4_ + 1;
      uStack_38 = CONCAT44(uVar5,(uint)uStack_38);
      pgVar3 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
               super__Vector_impl_data._M_start;
      pgVar4 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
               super__Vector_impl_data._M_finish;
      uVar9 = ((long)pgVar4 - (long)pgVar3 >> 3) * -0x1084210842108421;
    } while (uVar5 <= uVar9 && uVar9 - uVar5 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Root GDS structures: ",0x15);
  puVar7 = (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar7 != (__return_storage_ptr__->
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
      pgVar3 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
               super__Vector_impl_data._M_start;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,pgVar3[*puVar7].name._M_dataplus._M_p,
                 pgVar3[*puVar7].name._M_string_length);
      puVar7 = puVar7 + 1;
    } while (puVar7 != (__return_storage_ptr__->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  return __return_storage_ptr__;
}

Assistant:

vector<unsigned int> gdscpp::findRootSTR()
{
  cout << "Finding the root structures." << endl;

  vector<unsigned int> rootSTRindexes;
  bool vecFound;

  for (unsigned int i = 0; i < this->STR.size(); i++) {
    vecFound = false;
    for (unsigned int j = 0; j < this->STR.size(); j++) {
      for (unsigned int k = 0; k < this->STR[j].SREF.size(); k++) {
        if (!this->STR[i].name.compare(this->STR[j].SREF[k].name)) {
          vecFound = true;
          break;
        }
      }
      if (vecFound) {
        break;
      }
    }
    if (vecFound == false) {
      rootSTRindexes.push_back(i);
    }
  }

  // display the root GDS STR
  cout << "Root GDS structures: ";

  vector<unsigned int>::iterator fooVec;
  for (fooVec = rootSTRindexes.begin(); fooVec != rootSTRindexes.end();
       fooVec++) {
    cout << "  " << this->STR[*fooVec].name;
  }
  cout << endl;

  return rootSTRindexes;
}